

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall ot::commissioner::coap::Coap::HandleRequest(Coap *this,Request *aRequest)

{
  bool bVar1;
  Error *aError;
  Response *aMessage;
  pointer ppVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_418;
  Coap *local_3f8;
  anon_class_1_0_00000001 local_3ea;
  v10 local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  char *local_3e0;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  ErrorCode local_38c;
  Error local_388;
  Error local_360;
  Error local_338;
  Error local_310;
  iterator local_2e8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>
  local_2e0;
  iterator local_2d8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>
  local_2d0;
  Error local_2c8;
  Coap *local_2a0;
  anon_class_1_0_00000001 local_292;
  v10 local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  char *local_288;
  string local_280;
  allocator local_259;
  string local_258;
  ErrorCode local_238 [4];
  Error local_228;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>
  local_200;
  const_iterator resource;
  string uriPath;
  Response *response;
  Error error;
  Request *aRequest_local;
  Coap *this_local;
  undefined1 local_170 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  char *local_158;
  const_iterator *local_150;
  v10 *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  char *pcStack_138;
  string *local_130;
  v10 *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  undefined1 local_f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  char *local_e0;
  string *local_d8;
  v10 *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  char *pcStack_c0;
  string *local_b8;
  v10 *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  undefined8 local_68;
  undefined1 *local_60;
  Coap **local_58;
  undefined1 *local_50;
  Coap **local_48;
  undefined8 local_40;
  undefined1 *local_38;
  Coap **local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  char *pcStack_10;
  
  error.mMessage.field_2._8_8_ = aRequest;
  Error::Error((Error *)&response);
  std::__cxx11::string::string((string *)&resource);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>
  ::_Rb_tree_const_iterator(&local_200);
  Message::GetUriPath(&local_228,(Message *)error.mMessage.field_2._8_8_,(string *)&resource);
  aError = Error::operator=((Error *)&response,&local_228);
  local_238[0] = kNone;
  bVar1 = commissioner::operator!=(aError,local_238);
  Error::~Error(&local_228);
  if (!bVar1) {
    aMessage = ResponsesCache::Match(&this->mResponsesCache,(Request *)error.mMessage.field_2._8_8_)
    ;
    if (aMessage == (Response *)0x0) {
      local_2d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
           ::find(&this->mResources,(key_type *)&resource);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>
      ::_Rb_tree_const_iterator(&local_2d0,&local_2d8);
      local_200._M_node = local_2d0._M_node;
      local_2e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
           ::end(&this->mResources);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>
      ::_Rb_tree_const_iterator(&local_2e0,&local_2e8);
      bVar1 = std::operator!=(&local_200,&local_2e0);
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>
                 ::operator->(&local_200);
        Resource::HandleRequest(&ppVar2->second,(Message *)error.mMessage.field_2._8_8_);
        Error::Error(&local_310);
        Error::operator=((Error *)&response,&local_310);
        Error::~Error(&local_310);
      }
      else {
        bVar1 = std::operator!=(&this->mDefaultHandler,(nullptr_t)0x0);
        if (bVar1) {
          std::function<void_(const_ot::commissioner::coap::Message_&)>::operator()
                    (&this->mDefaultHandler,(Message *)error.mMessage.field_2._8_8_);
          Error::Error(&local_338);
          Error::operator=((Error *)&response,&local_338);
          Error::~Error(&local_338);
        }
        else {
          SendNotFound(&local_360,this,(Request *)error.mMessage.field_2._8_8_);
          IgnoreError(&local_360);
          Error::~Error(&local_360);
          Error::Error(&local_388);
          Error::operator=((Error *)&response,&local_388);
          Error::~Error(&local_388);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_258,"coap",&local_259);
      HandleRequest::anon_class_1_0_00000001::operator()(&local_292);
      local_120 = &local_290;
      local_128 = &local_291;
      bVar3 = ::fmt::v10::operator()(local_128);
      local_288 = (char *)bVar3.size_;
      local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.data_;
      ::fmt::v10::detail::
      check_format_string<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_130 = &local_280;
      local_140 = local_290;
      pcStack_138 = local_288;
      local_148 = (v10 *)&local_2a0;
      local_150 = &resource;
      local_a0 = &local_140;
      local_160 = local_290;
      local_158 = local_288;
      local_2a0 = this;
      local_98 = local_160;
      pcStack_90 = local_158;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string>
                ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this_local,local_148,&local_150->_M_node,local_290);
      local_50 = local_170;
      local_58 = &this_local;
      local_40 = 0xde;
      fmt.size_ = 0xde;
      fmt.data_ = local_158;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_58;
      local_48 = local_58;
      local_38 = local_50;
      local_30 = local_58;
      ::fmt::v10::vformat_abi_cxx11_(&local_280,(v10 *)local_160,fmt,args);
      Log(kInfo,&local_258,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      Send(&local_2c8,this,aMessage);
      Error::operator=((Error *)&response,&local_2c8);
      Error::~Error(&local_2c8);
    }
  }
  local_38c = kNone;
  bVar1 = commissioner::operator!=((Error *)&response,&local_38c);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,"coap",&local_3b1);
    HandleRequest::anon_class_1_0_00000001::operator()(&local_3ea);
    local_a8 = &local_3e8;
    local_b0 = &local_3e9;
    bVar3 = ::fmt::v10::operator()(local_b0);
    local_3e0 = (char *)bVar3.size_;
    local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    local_3f8 = this;
    Error::ToString_abi_cxx11_(&local_418,(Error *)&response);
    local_b8 = &local_3d8;
    local_c8 = local_3e8;
    pcStack_c0 = local_3e0;
    local_d0 = (v10 *)&local_3f8;
    local_d8 = &local_418;
    local_20 = &local_c8;
    local_e8 = local_3e8;
    local_e0 = local_3e0;
    local_18 = local_e8;
    pcStack_10 = local_e0;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string>
              (&local_118,local_d0,(void **)local_d8,local_3e8);
    local_78 = local_f8;
    local_80 = &local_118;
    local_68 = 0xde;
    fmt_00.size_ = 0xde;
    fmt_00.data_ = local_e0;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_80;
    local_70 = local_80;
    local_60 = local_78;
    local_28 = local_80;
    ::fmt::v10::vformat_abi_cxx11_(&local_3d8,(v10 *)local_e8,fmt_00,args_00);
    Log(kInfo,&local_3b0,&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  }
  std::__cxx11::string::~string((string *)&resource);
  Error::~Error((Error *)&response);
  return;
}

Assistant:

void Coap::HandleRequest(const Request &aRequest)
{
    Error                                error;
    const Response                      *response = nullptr;
    std::string                          uriPath;
    decltype(mResources)::const_iterator resource;

    SuccessOrExit(error = aRequest.GetUriPath(uriPath));

    response = mResponsesCache.Match(aRequest);
    if (response != nullptr)
    {
        LOG_INFO(LOG_REGION_COAP, "server(={}) found cached CoAP response for resource {}", static_cast<void *>(this),
                 uriPath);
        ExitNow(error = Send(*response));
    }

    resource = mResources.find(uriPath);
    if (resource != mResources.end())
    {
        resource->second.HandleRequest(aRequest);
        ExitNow(error = ERROR_NONE);
    }
    else if (mDefaultHandler != nullptr)
    {
        mDefaultHandler(aRequest);
        ExitNow(error = ERROR_NONE);
    }
    else
    {
        IgnoreError(SendNotFound(aRequest));
        ExitNow(error = ERROR_NONE);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_INFO(LOG_REGION_COAP, "server(={}) handle request failed: {}", static_cast<void *>(this), error.ToString());
    }
}